

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
          *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  MessageLite *pMVar2;
  ExtensionSet *this_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  LogMessage local_20;
  
  this_00 = (ExtensionSet *)(this + 0x10);
  bVar1 = ExtensionSet::Has(this_00,pb::test);
  if (bVar1) {
    pMVar2 = ExtensionSet::GetMessage
                       (this_00,pb::test,(MessageLite *)PTR__TestFeatures_default_instance__01970360
                       );
    if (((ulong)pMVar2[1]._vptr_MessageLite & 1) == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xee,"features.GetExtension(pb::test).has_file_feature()");
      str_00._M_str = "Test features were not resolved properly";
      str_00._M_len = 0x28;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_20,str_00);
    }
    else {
      pMVar2 = ExtensionSet::GetMessage
                         (this_00,pb::test,
                          (MessageLite *)PTR__TestFeatures_default_instance__01970360);
      if (((ulong)pMVar2[1]._vptr_MessageLite & 0x800) != 0) {
        return;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
      str_01._M_str = "Test features were not resolved properly";
      str_01._M_len = 0x28;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_20,str_01);
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0xec,"features.HasExtension(pb::test)");
    str._M_str = "Test features were not resolved properly";
    str._M_len = 0x28;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_20,str);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

void Visit(const FieldDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
  }